

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void dummy_NewJavascriptArrayNoArg(void)

{
  return;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArgNoCtorFull(Var instance, ScriptContext* requestContext)
    {
        // This helper can be reentrant because although we don't call the Constructor, we might have to parse it if bytecode is missing
        // In which case, we would leave script. When we leave script we DisposeObjects which can dispose of Edge objects that could
        // have a javascript onDispose handler and call that handler.
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoArgNoCtorFull);
        return NewScObjectNoArgNoCtorCommon(instance, requestContext, true);
        JIT_HELPER_END(NewScObjectNoArgNoCtorFull);
    }